

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini_bus.hpp
# Opt level: O0

shared_ptr<mini_bus::IBaseNotifyToken<std::__cxx11::list<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
 __thiscall mini_bus::MiniBusClient::keys_abi_cxx11_(MiniBusClient *this,string_view bucket)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  size_type sVar1;
  ostream *__os;
  size_t in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  string_view command;
  shared_ptr<mini_bus::IBaseNotifyToken<std::__cxx11::list<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  sVar2;
  string_view payload;
  anon_class_1_0_00000001_for_func local_219;
  undefined1 local_218 [16];
  basic_string_view<char,_std::char_traits<char>_> local_208;
  undefined1 local_1f8 [24];
  __string_type buf;
  ostringstream local_1a0 [8];
  ostringstream oss;
  MiniBusClient *this_local;
  string_view bucket_local;
  
  this_local = (MiniBusClient *)bucket._M_str;
  command._M_len = bucket._M_len;
  bucket_local._M_len = in_RCX;
  bucket_local._M_str = (char *)this;
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::length
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  __os = std::operator<<((ostream *)local_1a0,(uchar)sVar1);
  buf.field_2._8_8_ = this_local;
  __str._M_str = (char *)bucket_local._M_len;
  __str._M_len = (size_t)this_local;
  std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)__os,__str);
  std::__cxx11::ostringstream::str();
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_208,"KEYS");
  local_218 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)(local_1f8 + 0x10))
  ;
  command._M_str = (char *)local_208._M_len;
  payload._M_str = local_218._0_8_;
  payload._M_len = (size_t)local_208._M_str;
  send_simple_abi_cxx11_((MiniBusClient *)local_1f8,command,payload);
  operator>><std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_codehz[P]mini_bus_cpp_include_mini_bus_hpp:581:40)>
            ((mini_bus *)this,
             (shared_ptr<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_1f8,&local_219);
  std::
  shared_ptr<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~shared_ptr((shared_ptr<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_1f8);
  std::__cxx11::string::~string((string *)(local_1f8 + 0x10));
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  sVar2.
  super___shared_ptr<mini_bus::IBaseNotifyToken<std::__cxx11::list<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar2.
  super___shared_ptr<mini_bus::IBaseNotifyToken<std::__cxx11::list<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (shared_ptr<mini_bus::IBaseNotifyToken<std::__cxx11::list<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          )sVar2.
           super___shared_ptr<mini_bus::IBaseNotifyToken<std::__cxx11::list<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

inline std::shared_ptr<IBaseNotifyToken<std::list<std::tuple<ACL, std::string>>>> keys(std::string_view bucket) {
    std::ostringstream oss;
    oss << (unsigned char) bucket.length() << bucket;
    auto buf = oss.str();
    return send_simple("KEYS", buf) >> [](std::optional<std::string> res) -> std::list<std::tuple<ACL, std::string>> {
      std::istringstream iss{*res};
      std::list<std::tuple<ACL, std::string>> ret;
      while (true) {
        ACL acl;
        unsigned char len;
        iss >> len;
        if (!iss) break;
        char buf[16] = {};
        iss.read(buf, len);
        if (strcmp(buf, "private") == 0)
          acl = ACL::Private;
        else if (strcmp(buf, "protected") == 0)
          acl = ACL::Protected;
        else if (strcmp(buf, "public") == 0)
          acl = ACL::Public;
        iss >> len;
        char key[256];
        iss.read(key, len);
        ret.emplace_back(acl, std::string{key, (size_t) len});
      }
      return ret;
    };
  }